

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall
Fossilize::StreamArchive::write_entry
          (StreamArchive *this,ResourceTag tag,Hash hash,void *blob,size_t size,
          PayloadWriteFlags flags)

{
  int iVar1;
  iterator iVar2;
  size_t sVar3;
  mz_ulong mVar4;
  uint8_t *pDest;
  uint32_t uVar5;
  Hash hash_local;
  PayloadHeader header;
  mz_ulong zsize;
  PayloadHeaderRaw raw;
  char str [41];
  
  if (this->alive != true) {
    return false;
  }
  if (this->mode == ReadOnly) {
    return false;
  }
  hash_local = hash;
  iVar2 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this->seen_blobs[tag]._M_h,&hash_local);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
      ._M_cur != (__node_type *)0x0) {
    return true;
  }
  sprintf(str,"%0*x",0x18,tag);
  sprintf(str + 0x18,"%016lx",hash_local);
  sVar3 = fwrite(str,1,0x28,(FILE *)this->file);
  if (sVar3 != 0x28) {
    return false;
  }
  if ((flags & 1) == 0) {
    uVar5 = (uint32_t)size;
    header.uncompressed_size = uVar5;
    if ((flags & 2) != 0) {
      mVar4 = mz_compressBound(size);
      pDest = this->zlib_buffer;
      zsize = this->zlib_buffer_size;
      if (zsize < mVar4) {
        pDest = (uint8_t *)realloc(pDest,mVar4);
        zsize = mVar4;
        if (pDest == (uint8_t *)0x0) {
          free(this->zlib_buffer);
          zsize = 0;
        }
        this->zlib_buffer = pDest;
        this->zlib_buffer_size = zsize;
      }
      if (pDest == (uchar *)0x0) {
        return false;
      }
      header.format = 2;
      header.crc = 0;
      raw.data[0] = '\0';
      raw.data[1] = '\0';
      raw.data[2] = '\0';
      raw.data[3] = '\0';
      raw.data[4] = '\0';
      raw.data[5] = '\0';
      raw.data[6] = '\0';
      raw.data[7] = '\0';
      raw.data[8] = '\0';
      raw.data[9] = '\0';
      raw.data[10] = '\0';
      raw.data[0xb] = '\0';
      raw.data[0xc] = '\0';
      raw.data[0xd] = '\0';
      raw.data[0xe] = '\0';
      raw.data[0xf] = '\0';
      iVar1 = mz_compress2(pDest,&zsize,(uchar *)blob,size,(flags & 4) * 2 + 1);
      if (iVar1 != 0) {
        return false;
      }
      header.payload_size = (uint32_t)zsize;
      if ((flags & 8) != 0) {
        mVar4 = mz_crc32(0,this->zlib_buffer,zsize);
        header.crc = (uint32_t)mVar4;
      }
      convert_to_le(&raw,&header);
      sVar3 = fwrite(&raw,1,0x10,(FILE *)this->file);
      if (sVar3 != 0x10) {
        return false;
      }
      sVar3 = fwrite(this->zlib_buffer,1,(ulong)header.payload_size,(FILE *)this->file);
      if (sVar3 != header.payload_size) {
        return false;
      }
      goto LAB_0016dd56;
    }
    header.crc = 0;
    if ((flags & 8) != 0) {
      mVar4 = mz_crc32(0,(mz_uint8 *)blob,size);
      header.crc = (uint32_t)mVar4;
    }
    header.format = 1;
    raw.data[0] = '\0';
    raw.data[1] = '\0';
    raw.data[2] = '\0';
    raw.data[3] = '\0';
    raw.data[4] = '\0';
    raw.data[5] = '\0';
    raw.data[6] = '\0';
    raw.data[7] = '\0';
    raw.data[8] = '\0';
    raw.data[9] = '\0';
    raw.data[10] = '\0';
    raw.data[0xb] = '\0';
    raw.data[0xc] = '\0';
    raw.data[0xd] = '\0';
    raw.data[0xe] = '\0';
    raw.data[0xf] = '\0';
    header.payload_size = uVar5;
    convert_to_le(&raw,&header);
    sVar3 = fwrite(&raw,1,0x10,(FILE *)this->file);
    if (sVar3 != 0x10) {
      return false;
    }
  }
  else if (size < 0x10) {
    return false;
  }
  sVar3 = fwrite(blob,1,size,(FILE *)this->file);
  if (sVar3 != size) {
    return false;
  }
LAB_0016dd56:
  header.payload_size = 0;
  header.format = 0;
  header.crc = 0;
  header.uncompressed_size = 0;
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_long&,Fossilize::StreamArchive::Entry>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->seen_blobs[tag]._M_h,&hash_local);
  return true;
}

Assistant:

bool write_entry(ResourceTag tag, Hash hash, const void *blob, size_t size, PayloadWriteFlags flags) override
	{
		if (!alive || mode == DatabaseMode::ReadOnly)
			return false;

		auto itr = seen_blobs[tag].find(hash);
		if (itr != end(seen_blobs[tag]))
			return true;

		char str[FOSSILIZE_BLOB_HASH_LENGTH + 1]; // 40 digits + null
		sprintf(str, "%0*x", FOSSILIZE_BLOB_HASH_LENGTH - 16, tag);
		sprintf(str + FOSSILIZE_BLOB_HASH_LENGTH - 16, "%016" PRIx64, hash);

		if (fwrite(str, 1, FOSSILIZE_BLOB_HASH_LENGTH, file) != FOSSILIZE_BLOB_HASH_LENGTH)
			return false;

		if ((flags & PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT) != 0)
		{
			// The raw payload already contains the header, so just dump it straight to disk.
			if (size < sizeof(PayloadHeaderRaw))
				return false;
			if (fwrite(blob, 1, size, file) != size)
				return false;
		}
		else if ((flags & PAYLOAD_WRITE_COMPRESS_BIT) != 0)
		{
			auto compressed_bound = mz_compressBound(size);

			if (zlib_buffer_size < compressed_bound)
			{
				auto *new_zlib_buffer = static_cast<uint8_t *>(realloc(zlib_buffer, compressed_bound));
				if (new_zlib_buffer)
				{
					zlib_buffer = new_zlib_buffer;
					zlib_buffer_size = compressed_bound;
				}
				else
				{
					free(zlib_buffer);
					zlib_buffer = nullptr;
					zlib_buffer_size = 0;
				}
			}

			if (!zlib_buffer)
				return false;

			PayloadHeader header = {};
			PayloadHeaderRaw header_raw = {};
			header.uncompressed_size = uint32_t(size);
			header.format = FOSSILIZE_COMPRESSION_DEFLATE;

			mz_ulong zsize = zlib_buffer_size;
			if (mz_compress2(zlib_buffer, &zsize, static_cast<const unsigned char *>(blob), size,
			                 (flags & PAYLOAD_WRITE_BEST_COMPRESSION_BIT) != 0 ? MZ_BEST_COMPRESSION : MZ_BEST_SPEED) != MZ_OK)
				return false;

			header.payload_size = uint32_t(zsize);
			if ((flags & PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT) != 0)
				header.crc = uint32_t(mz_crc32(MZ_CRC32_INIT, zlib_buffer, zsize));

			convert_to_le(header_raw, header);
			if (fwrite(&header_raw, 1, sizeof(header_raw), file) != sizeof(header_raw))
				return false;

			if (fwrite(zlib_buffer, 1, header.payload_size, file) != header.payload_size)
				return false;
		}
		else
		{
			uint32_t crc = 0;
			if ((flags & PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT) != 0)
				crc = uint32_t(mz_crc32(MZ_CRC32_INIT, static_cast<const unsigned char *>(blob), size));

			PayloadHeader header = { uint32_t(size), FOSSILIZE_COMPRESSION_NONE, crc, uint32_t(size) };
			PayloadHeaderRaw raw = {};
			convert_to_le(raw, header);

			if (fwrite(&raw, 1, sizeof(raw), file) != sizeof(raw))
				return false;

			if (fwrite(blob, 1, size, file) != size)
				return false;
		}

		// The entry is irrelevant, we're not going to read from this archive any time soon.
		seen_blobs[tag].emplace(hash, Entry{});
		return true;
	}